

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O2

void __thiscall RenX_ServerListPlugin::updateServerList(RenX_ServerListPlugin *this)

{
  string *this_00;
  Server *pSVar1;
  char cVar2;
  long lVar3;
  long local_68;
  long local_60;
  string local_50;
  
  RenX::getCore();
  RenX::Core::getServers();
  this_00 = &this->m_server_list_json;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,'[');
  lVar3 = 0;
  do {
    if (lVar3 == local_60 - local_68 >> 3) {
LAB_001109dc:
      for (; lVar3 != local_60 - local_68 >> 3; lVar3 = lVar3 + 1) {
        pSVar1 = *(Server **)(local_68 + lVar3 * 8);
        cVar2 = RenX::Server::isConnected();
        if (cVar2 != '\0') {
          cVar2 = RenX::Server::isFullyConnected();
          if (cVar2 != '\0') {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(this_00,',');
            server_as_json_abi_cxx11_(&local_50,this,pSVar1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (this_00,&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this_00,']');
      updateMetadata(this);
      std::_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~_Vector_base
                ((_Vector_base<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)&local_68);
      return;
    }
    pSVar1 = *(Server **)(local_68 + lVar3 * 8);
    cVar2 = RenX::Server::isConnected();
    if (cVar2 != '\0') {
      cVar2 = RenX::Server::isFullyConnected();
      if (cVar2 != '\0') {
        server_as_json_abi_cxx11_(&local_50,this,pSVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        lVar3 = lVar3 + 1;
        goto LAB_001109dc;
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void RenX_ServerListPlugin::updateServerList() {
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;
	RenX::Server *server;

	// regenerate server_list_json

	m_server_list_json = '[';

	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			m_server_list_json += server_as_json(*server);

			++index;
			break;
		}
		++index;
	}
	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			m_server_list_json += ',';
			m_server_list_json += server_as_json(*server);
		}
		++index;
	}

	m_server_list_json += ']';

	// Also update metadata so that it reflects any changes
	updateMetadata();
}